

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_transfer_particle_contents(FILE *fo,mcpl_file_t ffi,uint64_t nparticles)

{
  uint uVar1;
  int iVar2;
  char *__ptr;
  size_t sVar3;
  ulong in_RDX;
  undefined8 *in_RSI;
  FILE *in_RDI;
  uint64_t nb;
  uint64_t toread;
  uint64_t np_remaining;
  char *buf;
  uint npbufsize;
  uint particle_size;
  mcpl_fileinternal_t *fi;
  size_t in_stack_ffffffffffffffb0;
  ulong uVar4;
  size_t local_48;
  ulong local_38;
  
  if (in_RDX != 0) {
    uVar1 = *(uint *)(in_RSI + 0xf);
    __ptr = mcpl_internal_malloc(in_stack_ffffffffffffffb0);
    local_38 = in_RDX;
    while (local_38 != 0) {
      uVar4 = local_38;
      if (999 < local_38) {
        uVar4 = 1000;
      }
      local_38 = local_38 - uVar4;
      if (in_RSI[1] == 0) {
        local_48 = fread(__ptr,1,uVar4 * uVar1,(FILE *)*in_RSI);
      }
      else {
        iVar2 = gzread(in_RSI[1],__ptr,(int)uVar4 * uVar1);
        local_48 = (size_t)iVar2;
      }
      if (local_48 != uVar4 * uVar1) {
        mcpl_error((char *)0x107647);
      }
      sVar3 = fwrite(__ptr,1,uVar4 * uVar1,in_RDI);
      if (sVar3 != uVar4 * uVar1) {
        mcpl_error((char *)0x107690);
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void mcpl_transfer_particle_contents(FILE * fo, mcpl_file_t ffi, uint64_t nparticles)
{
  mcpl_fileinternal_t * fi = (mcpl_fileinternal_t *)ffi.internal;
  assert(fi);

  if (!nparticles)
    return;//no particles to transfer

  unsigned particle_size = fi->particle_size;

  //buffer for transferring up to 1000 particles at a time:
  const unsigned npbufsize = 1000;
  char * buf = mcpl_internal_malloc(npbufsize*particle_size);
  uint64_t np_remaining = nparticles;

  while(np_remaining) {
    //NB: On linux > 2.6.33 we could use sendfile for more efficient in-kernel
    //transfer of data between two files!
    uint64_t toread = np_remaining >= npbufsize ? npbufsize : np_remaining;
    np_remaining -= toread;

    //read:
    uint64_t nb;
    if (fi->filegz) {
      assert( ((unsigned)toread)*particle_size < UINT32_MAX );
      nb = gzread(fi->filegz, buf, ((unsigned)toread)*particle_size);
    } else {
      nb = fread(buf,1,toread*particle_size,fi->file);
    }
    if (nb!=toread*particle_size)
      mcpl_error("Unexpected read-error while merging");

    //write:
    nb = fwrite(buf,1,toread*particle_size,fo);
    if (nb!=toread*particle_size)
      mcpl_error("Unexpected write-error while merging");
  }

  free(buf);
}